

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::SetViewports
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,Uint32 NumViewports,
          Viewport *pViewports,Uint32 *RTWidth,Uint32 *RTHeight)

{
  Uint32 *pUVar1;
  COMMAND_QUEUE_TYPE CVar2;
  undefined8 uVar3;
  Float32 FVar4;
  Uint32 UVar5;
  Viewport *extraout_RDX;
  Viewport *extraout_RDX_00;
  Viewport *pVVar6;
  char *Args_2;
  char (*in_R9) [8];
  ulong uVar7;
  Float32 *Args_2_00;
  string msg;
  Viewport DefaultVP;
  _Alloc_hider in_stack_ffffffffffffff88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  Uint32 local_54;
  undefined1 local_50 [12];
  float local_44;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  pVVar6 = pViewports;
  Args_2 = (char *)RTHeight;
  local_54 = NumViewports;
  if ((this->m_Desc).QueueType == COMMAND_QUEUE_TYPE_UNKNOWN) {
    if ((this->m_Desc).IsDeferred == false) {
      FormatString<char[79]>
                ((string *)&stack0xffffffffffffff88,
                 (char (*) [79])
                 "Queue type may never be unknown for immediate contexts. This looks like a bug.");
      DebugAssertionFailed
                (in_stack_ffffffffffffff88._M_p,"SetViewports",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x390);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)in_stack_ffffffffffffff88._M_p != &local_68) {
        operator_delete(in_stack_ffffffffffffff88._M_p,local_68._M_allocated_capacity + 1);
      }
    }
    FormatString<char[97]>
              ((string *)&stack0xffffffffffffff88,
               (char (*) [97])
               "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
              );
    DebugAssertionFailed
              (in_stack_ffffffffffffff88._M_p,"SetViewports",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x390);
    pVVar6 = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_ffffffffffffff88._M_p != &local_68) {
      operator_delete(in_stack_ffffffffffffff88._M_p,local_68._M_allocated_capacity + 1);
      pVVar6 = extraout_RDX_00;
    }
  }
  CVar2 = (this->m_Desc).QueueType;
  if ((~CVar2 & 7) != 0) {
    GetCommandQueueTypeString_abi_cxx11_
              ((String *)local_50,(Diligent *)(ulong)CVar2,(COMMAND_QUEUE_TYPE)pVVar6);
    Args_2 = " queue.";
    FormatString<char[13],char[22],std::__cxx11::string,char[8]>
              ((string *)&stack0xffffffffffffff88,(Diligent *)"SetViewports",(char (*) [13])0x917e3a
               ,(char (*) [22])local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",in_R9)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._0_8_ != &local_40) {
      operator_delete((void *)local_50._0_8_,local_40._M_allocated_capacity + 1);
    }
    DebugAssertionFailed
              (in_stack_ffffffffffffff88._M_p,"SetViewports",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x390);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_ffffffffffffff88._M_p != &local_68) {
      operator_delete(in_stack_ffffffffffffff88._M_p,local_68._M_allocated_capacity + 1);
    }
  }
  if ((1 < local_54) &&
     ((((this->m_pDevice).m_pObject)->
      super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
      ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_DeviceInfo.Features.MultiViewport ==
      DEVICE_FEATURE_STATE_DISABLED)) {
    FormatString<char[77]>
              ((string *)&stack0xffffffffffffff88,
               (char (*) [77])
               "IDeviceContext::SetViewports: multi viewport is not supported by this device");
    DebugAssertionFailed
              (in_stack_ffffffffffffff88._M_p,"SetViewports",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x395);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_ffffffffffffff88._M_p != &local_68) {
      operator_delete(in_stack_ffffffffffffff88._M_p,local_68._M_allocated_capacity + 1);
    }
  }
  if ((*RTWidth == 0) || (*RTHeight == 0)) {
    *RTWidth = this->m_FramebufferWidth;
    *RTHeight = this->m_FramebufferHeight;
  }
  if (0xf < local_54) {
    Args_2 = (char *)&MAX_VIEWPORTS;
    FormatString<char[22],unsigned_int,char[22],unsigned_int,char[2]>
              ((string *)&stack0xffffffffffffff88,(Diligent *)"Number of viewports (",
               (char (*) [22])&local_54,(uint *)") exceeds the limit (",
               (char (*) [22])&MAX_VIEWPORTS,(uint *)0x930f15,
               (char (*) [2])in_stack_ffffffffffffff88._M_p);
    DebugAssertionFailed
              (in_stack_ffffffffffffff88._M_p,"SetViewports",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x39d);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_ffffffffffffff88._M_p != &local_68) {
      operator_delete(in_stack_ffffffffffffff88._M_p,local_68._M_allocated_capacity + 1);
    }
  }
  UVar5 = 0x10;
  if (local_54 < 0x10) {
    UVar5 = local_54;
  }
  this->m_NumViewports = UVar5;
  local_50._0_8_ = (pointer)0x0;
  local_50._8_4_ = (float)*RTWidth;
  local_44 = (float)*RTHeight;
  local_40._M_allocated_capacity = 0x3f80000000000000;
  pVVar6 = (Viewport *)local_50;
  if (local_54 != 1) {
    pVVar6 = pViewports;
  }
  if (pViewports != (Viewport *)0x0) {
    pVVar6 = pViewports;
  }
  if (pVVar6 == (Viewport *)0x0) {
    FormatString<char[28]>
              ((string *)&stack0xffffffffffffff88,(char (*) [28])"pViewports must not be null");
    DebugAssertionFailed
              (in_stack_ffffffffffffff88._M_p,"SetViewports",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x3a6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_ffffffffffffff88._M_p != &local_68) {
      operator_delete(in_stack_ffffffffffffff88._M_p,local_68._M_allocated_capacity + 1);
    }
  }
  if (this->m_NumViewports != 0) {
    Args_2_00 = &this->m_Viewports[0].MaxDepth;
    uVar7 = 0;
    do {
      FVar4 = pVVar6->TopLeftY;
      uVar3 = *(undefined8 *)&pVVar6->Width;
      ((Viewport *)(Args_2_00 + -5))->TopLeftX = pVVar6->TopLeftX;
      ((Viewport *)(Args_2_00 + -5))->TopLeftY = FVar4;
      *(undefined8 *)(Args_2_00 + -3) = uVar3;
      *(undefined8 *)(Args_2_00 + -1) = *(undefined8 *)&pVVar6->MinDepth;
      if ((float)Args_2_00[-3] < 0.0) {
        FormatString<char[27],float,char[2]>
                  ((string *)&stack0xffffffffffffff88,(Diligent *)"Incorrect viewport width (",
                   (char (*) [27])(Args_2_00 + -3),(float *)0x930f15,(char (*) [2])Args_2);
        DebugAssertionFailed
                  (in_stack_ffffffffffffff88._M_p,"SetViewports",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                   ,0x3ab);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)in_stack_ffffffffffffff88._M_p != &local_68) {
          operator_delete(in_stack_ffffffffffffff88._M_p,local_68._M_allocated_capacity + 1);
        }
      }
      if ((float)Args_2_00[-2] < 0.0) {
        FormatString<char[28],float,char[2]>
                  ((string *)&stack0xffffffffffffff88,(Diligent *)"Incorrect viewport height (",
                   (char (*) [28])(Args_2_00 + -2),(float *)0x930f15,(char (*) [2])Args_2);
        DebugAssertionFailed
                  (in_stack_ffffffffffffff88._M_p,"SetViewports",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                   ,0x3ac);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)in_stack_ffffffffffffff88._M_p != &local_68) {
          operator_delete(in_stack_ffffffffffffff88._M_p,local_68._M_allocated_capacity + 1);
        }
      }
      if ((float)*Args_2_00 < (float)Args_2_00[-1]) {
        Args_2 = (char *)Args_2_00;
        FormatString<char[33],float,char[3],float,char[2]>
                  ((string *)&stack0xffffffffffffff88,(Diligent *)"Incorrect viewport depth range ["
                   ,(char (*) [33])(Args_2_00 + -1),(float *)0x92ff04,(char (*) [3])Args_2_00,
                   (float *)0x8bf931,(char (*) [2])in_stack_ffffffffffffff88._M_p);
        DebugAssertionFailed
                  (in_stack_ffffffffffffff88._M_p,"SetViewports",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                   ,0x3ad);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)in_stack_ffffffffffffff88._M_p != &local_68) {
          operator_delete(in_stack_ffffffffffffff88._M_p,local_68._M_allocated_capacity + 1);
        }
      }
      uVar7 = uVar7 + 1;
      pVVar6 = pVVar6 + 1;
      Args_2_00 = Args_2_00 + 6;
    } while (uVar7 < this->m_NumViewports);
  }
  pUVar1 = &(this->m_Stats).CommandCounters.SetViewports;
  *pUVar1 = *pUVar1 + 1;
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::SetViewports(
    Uint32          NumViewports,
    const Viewport* pViewports,
    Uint32&         RTWidth,
    Uint32&         RTHeight)
{
    DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_GRAPHICS, "SetViewports");

    if (NumViewports > 1)
    {
        DEV_CHECK_ERR(m_pDevice->GetFeatures().MultiViewport,
                      "IDeviceContext::SetViewports: multi viewport is not supported by this device");
    }
    if (RTWidth == 0 || RTHeight == 0)
    {
        RTWidth  = m_FramebufferWidth;
        RTHeight = m_FramebufferHeight;
    }

    DEV_CHECK_ERR(NumViewports < MAX_VIEWPORTS, "Number of viewports (", NumViewports, ") exceeds the limit (", MAX_VIEWPORTS, ")");
    m_NumViewports = (std::min)(MAX_VIEWPORTS, NumViewports);

    Viewport DefaultVP{RTWidth, RTHeight};
    // If no viewports are specified, use default viewport
    if (m_NumViewports == 1 && pViewports == nullptr)
    {
        pViewports = &DefaultVP;
    }
    DEV_CHECK_ERR(pViewports != nullptr, "pViewports must not be null");

    for (Uint32 vp = 0; vp < m_NumViewports; ++vp)
    {
        m_Viewports[vp] = pViewports[vp];
        DEV_CHECK_ERR(m_Viewports[vp].Width >= 0, "Incorrect viewport width (", m_Viewports[vp].Width, ")");
        DEV_CHECK_ERR(m_Viewports[vp].Height >= 0, "Incorrect viewport height (", m_Viewports[vp].Height, ")");
        DEV_CHECK_ERR(m_Viewports[vp].MaxDepth >= m_Viewports[vp].MinDepth, "Incorrect viewport depth range [", m_Viewports[vp].MinDepth, ", ", m_Viewports[vp].MaxDepth, "]");
    }

    ++m_Stats.CommandCounters.SetViewports;
}